

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::upper_bound
          (iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  rbtree *prVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  iterator *it;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  treeNode<ft::pair<const_int,_int>_> *ptVar5;
  bool bVar6;
  
  prVar1 = &(this->
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).m_tree;
  ptVar4 = ((this->
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).m_tree.m_first)->parent;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118940;
  __return_storage_ptr__->m_tree = prVar1;
  ptVar2 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.m_last;
  bVar6 = ptVar4 == ptVar2;
  if (bVar6) {
LAB_0010ddc0:
    __return_storage_ptr__->m_node = ptVar4;
  }
  else {
    if ((ptVar4->value).first <= *k) {
      do {
        ptVar3 = ptVar4->right;
        ptVar5 = ptVar4;
        if (ptVar4->right == prVar1->NIL) {
          do {
            ptVar4 = ptVar5->parent;
            bVar6 = ptVar4->right == ptVar5;
            ptVar5 = ptVar4;
          } while (bVar6);
        }
        else {
          do {
            ptVar4 = ptVar3;
            ptVar3 = ptVar4->left;
          } while (ptVar4->left != prVar1->NIL);
        }
        bVar6 = ptVar4 == ptVar2;
        if (bVar6) goto LAB_0010ddc0;
      } while ((ptVar4->value).first <= *k);
    }
    __return_storage_ptr__->m_node = ptVar4;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118940;
  __return_storage_ptr__->m_tree = prVar1;
  __return_storage_ptr__->m_node = ptVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator		upper_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, it->first)) return it;
		}
		return this->end();
	}